

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solbase.h
# Opt level: O2

SolBase<double> * __thiscall
soplex::SolBase<double>::operator=
          (SolBase<double> *this,
          SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          *sol)

{
  byte bVar1;
  byte bVar2;
  double dVar3;
  
  if ((SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
       *)this != sol) {
    this->field_0x98 = this->field_0x98 & 0xfe | sol->field_0xd0 & 1;
    VectorBase<double>::operator=(&this->_primal,&sol->_primal);
    VectorBase<double>::operator=(&this->_slacks,&sol->_slacks);
    dVar3 = boost::multiprecision::
            number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
            ::convert_to<double>(&sol->_objVal);
    this->_objVal = dVar3;
    bVar2 = sol->field_0xd0 & 2;
    bVar1 = this->field_0x98 & 0xfd | bVar2;
    this->field_0x98 = bVar1;
    if (bVar2 != 0) {
      VectorBase<double>::operator=(&this->_primalRay,&sol->_primalRay);
      bVar1 = this->field_0x98;
    }
    this->field_0x98 = bVar1 & 0xfb | sol->field_0xd0 & 4;
    VectorBase<double>::operator=(&this->_dual,&sol->_dual);
    VectorBase<double>::operator=(&this->_redCost,&sol->_redCost);
    bVar1 = sol->field_0xd0 & 8;
    this->field_0x98 = this->field_0x98 & 0xf7 | bVar1;
    if (bVar1 != 0) {
      VectorBase<double>::operator=(&this->_dualFarkas,&sol->_dualFarkas);
    }
  }
  return this;
}

Assistant:

SolBase<R>& operator=(const SolBase<S>& sol)
   {
      if((SolBase<S>*)this != &sol)
      {

         _isPrimalFeasible = sol._isPrimalFeasible;
         _primal = sol._primal;
         _slacks = sol._slacks;

         _objVal = R(sol._objVal);

         _hasPrimalRay = sol._hasPrimalRay;

         if(_hasPrimalRay)
            _primalRay = sol._primalRay;

         _isDualFeasible = sol._isDualFeasible;
         _dual = sol._dual;
         _redCost = sol._redCost;

         _hasDualFarkas = sol._hasDualFarkas;

         if(_hasDualFarkas)
            _dualFarkas = sol._dualFarkas;
      }

      return *this;
   }